

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# widgets.h
# Opt level: O3

void __thiscall dlib::label::label(label *this,drawable_window *w)

{
  drawable::drawable(&this->super_drawable,w,0);
  (this->super_drawable)._vptr_drawable = (_func_int **)&PTR__label_00314ae0;
  (this->text_)._M_dataplus._M_p = (pointer)&(this->text_).field_2;
  (this->text_)._M_string_length = 0;
  (this->text_).field_2._M_local_buf[0] = 0;
  (this->text_color_).red = '\0';
  (this->text_color_).green = '\0';
  (this->text_color_).blue = '\0';
  drawable::enable_events(&this->super_drawable);
  return;
}

Assistant:

label(
            drawable_window& w
        ) : 
            drawable(w),
            text_color_(0,0,0)
        {
            enable_events();
        }